

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.hpp
# Opt level: O3

shared_ptr<helics::Broker> __thiscall
helics::BrokerFactory::
BrokerTypeBuilder<helics::NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6>_>
::build(BrokerTypeBuilder<helics::NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6>_>
        *this,string_view name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::Broker> sVar1;
  undefined1 local_39;
  BrokerBuilder local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_len = (size_t)name._M_str;
  local_38._vptr_BrokerBuilder = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::NetworkBroker<helics::tcp::TcpComms,(gmlc::networking::InterfaceTypes)0,6>,std::allocator<helics::NetworkBroker<helics::tcp::TcpComms,(gmlc::networking::InterfaceTypes)0,6>>,std::basic_string_view<char,std::char_traits<char>>&>
            (a_Stack_30,
             (NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6> **)
             &local_38,
             (allocator<helics::NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6>_>
              *)&local_39,&local_20);
  (this->super_BrokerBuilder)._vptr_BrokerBuilder = local_38._vptr_BrokerBuilder;
  this[1].super_BrokerBuilder._vptr_BrokerBuilder = (_func_int **)a_Stack_30[0]._M_pi;
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<helics::Broker>)
         sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<Broker> build(std::string_view name) override
        {
            return std::make_shared<BrokerTYPE>(name);
        }